

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolordialog.cpp
# Opt level: O1

void __thiscall QtPrivate::QColorWell::mouseMoveEvent(QColorWell *this,QMouseEvent *e)

{
  ulong uVar1;
  LayoutDirection LVar2;
  QMimeData *this_00;
  QDrag *this_01;
  long in_FS_OFFSET;
  int iVar3;
  int iVar5;
  undefined1 auVar4 [16];
  int iVar6;
  int iVar7;
  undefined1 auVar8 [16];
  QPainter p;
  undefined1 *local_80;
  undefined8 local_78;
  int iStack_70;
  int iStack_6c;
  undefined1 *local_68;
  undefined1 *puStack_60;
  anon_union_24_3_e3d07ef4_for_data local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QWidget::mouseMoveEvent((QWidget *)this,e);
  if (this->mousePressed == true) {
    auVar8 = QEventPoint::position();
    auVar4._0_8_ = (double)((ulong)auVar8._0_8_ & 0x8000000000000000 | 0x3fe0000000000000) +
                   auVar8._0_8_;
    auVar4._8_8_ = (double)((ulong)auVar8._8_8_ & 0x8000000000000000 | 0x3fe0000000000000) +
                   auVar8._8_8_;
    auVar4 = minpd(_DAT_0066f5d0,auVar4);
    auVar4 = maxpd(auVar4,_DAT_0066f5e0);
    iVar6 = (this->pressPos).xp.m_i - (int)auVar4._0_8_;
    iVar7 = (this->pressPos).yp.m_i - (int)auVar4._8_8_;
    iVar3 = iVar6 >> 0x1f;
    iVar5 = iVar7 >> 0x1f;
    uVar1 = CONCAT44(iVar7,iVar6) ^ CONCAT44(iVar5,iVar3);
    iVar6 = QApplication::startDragDistance();
    if (iVar6 < ((int)(uVar1 >> 0x20) - iVar5) + ((int)uVar1 - iVar3)) {
      (**(code **)(*(long *)&(this->super_QWellArray).super_QWidget + 0x1a0))
                (this,(this->oldCurrent).xp.m_i,(this->oldCurrent).yp.m_i);
      iVar6 = (this->pressPos).xp.m_i;
      iVar3 = (this->pressPos).yp.m_i;
      iVar5 = (this->super_QWellArray).cellh;
      LVar2 = QWidget::layoutDirection((QWidget *)this);
      if (LVar2 == RightToLeft) {
        iVar6 = ~(iVar6 / (this->super_QWellArray).cellw) + (this->super_QWellArray).ncols;
      }
      else {
        iVar6 = iVar6 / (this->super_QWellArray).cellw;
      }
      local_68 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
      QColor::QColor((QColor *)&local_68,
                     this->values[iVar6 * (this->super_QWellArray).nrows + iVar3 / iVar5]);
      this_00 = (QMimeData *)operator_new(0x10);
      QMimeData::QMimeData(this_00);
      QColor::operator_cast_to_QVariant((QVariant *)&local_58,(QColor *)&local_68);
      QMimeData::setColorData((QVariant *)this_00);
      ::QVariant::~QVariant((QVariant *)&local_58);
      local_58._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_58.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
      local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QPixmap::QPixmap((QPixmap *)local_58.data,(this->super_QWellArray).cellw,
                       (this->super_QWellArray).cellh);
      QPixmap::fill((QColor *)&local_58);
      local_80 = &DAT_aaaaaaaaaaaaaaaa;
      QPainter::QPainter((QPainter *)&local_80,(QPaintDevice *)local_58.data);
      iVar6 = QPixmap::width();
      iVar3 = QPixmap::height();
      local_78._0_4_ = 0;
      local_78._4_4_ = 0;
      _iStack_70 = CONCAT44(iVar3 + -2,iVar6 + -2);
      QPainter::drawRects((QRect *)&local_80,(int)&local_78);
      QPainter::end();
      this_01 = (QDrag *)operator_new(0x10);
      QDrag::QDrag(this_01,(QObject *)this);
      QDrag::setMimeData((QMimeData *)this_01);
      QDrag::setPixmap((QPixmap *)this_01);
      this->mousePressed = false;
      QDrag::exec(this_01,1);
      QPainter::~QPainter((QPainter *)&local_80);
      QPixmap::~QPixmap((QPixmap *)local_58.data);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QColorWell::mouseMoveEvent(QMouseEvent *e)
{
    QWellArray::mouseMoveEvent(e);
#if QT_CONFIG(draganddrop)
    if (!mousePressed)
        return;
    if ((pressPos - e->position().toPoint()).manhattanLength() > QApplication::startDragDistance()) {
        setCurrent(oldCurrent.x(), oldCurrent.y());
        int i = rowAt(pressPos.y()) + columnAt(pressPos.x()) * numRows();
        QColor col(values[i]);
        QMimeData *mime = new QMimeData;
        mime->setColorData(col);
        QPixmap pix(cellWidth(), cellHeight());
        pix.fill(col);
        QPainter p(&pix);
        p.drawRect(0, 0, pix.width() - 1, pix.height() - 1);
        p.end();
        QDrag *drg = new QDrag(this);
        drg->setMimeData(mime);
        drg->setPixmap(pix);
        mousePressed = false;
        drg->exec(Qt::CopyAction);
    }
#endif
}